

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsxgen_spec(prscxdef *ctx)

{
  prsndef *in_RDI;
  prscxdef *unaff_retaddr;
  prsndef *exprnode;
  prsndef *in_stack_00000028;
  prscxdef *in_stack_00000030;
  prscxdef *in_stack_fffffffffffffff0;
  
  prsexpr(in_stack_fffffffffffffff0);
  prs_check_spec(unaff_retaddr,in_RDI);
  prsgexp(in_stack_00000030,in_stack_00000028);
  in_RDI[1].prsnv.prsnvn[2] = in_RDI[1].prsnv.prsnvn[5];
  *(undefined2 *)((long)&in_RDI[1].prsnv + 0x20) = *(undefined2 *)((long)&in_RDI[1].prsnv + 0x30);
  return;
}

Assistant:

void prsxgen_spec(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for speculative execution problems */
    prs_check_spec(ctx, exprnode);

    /* generate the expression, then reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}